

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::RawDescriptor::ToStringExtra_abi_cxx11_(RawDescriptor *this)

{
  long lVar1;
  Span<const_unsigned_char> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000050 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Span<const_unsigned_char>::Span<CScript>(in_RSI,(CScript *)in_RDI,in_RDI);
  HexStr_abi_cxx11_((Span<const_unsigned_char>)in_stack_00000050);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToStringExtra() const override { return HexStr(m_script); }